

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  undefined1 *puVar1;
  char *hostname;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  Curl_dns_entry *pCVar4;
  
  hostname = (data->state).async.hostname;
  if (hostname == (char *)0x0) {
    CVar3 = CURLE_FAILED_INIT;
  }
  else {
    pCVar4 = Curl_dnscache_get(data,hostname,(data->state).async.port,(data->state).async.ip_version
                              );
    *dns = pCVar4;
    if (pCVar4 == (Curl_dns_entry *)0x0) {
      if (((data->conn->bits).field_0x3 & 2) == 0) {
        CVar3 = Curl_async_is_resolved(data,dns);
      }
      else {
        CVar3 = Curl_doh_is_resolved(data,dns);
      }
      if (*dns != (Curl_dns_entry *)0x0) {
        show_resolve_info(data,*dns);
      }
    }
    else {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Hostname \'%s\' was found in DNS cache",(data->state).async.hostname);
      }
      Curl_async_shutdown(data);
      (data->state).async.dns = *dns;
      puVar1 = &(data->state).async.field_0x28;
      *puVar1 = *puVar1 | 1;
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
  CURLcode result;

  /* If async resolving is ongoing, this must be set */
  if(!data->state.async.hostname)
    return CURLE_FAILED_INIT;

  /* check if we have the name resolved by now (from someone else) */
  *dns = Curl_dnscache_get(data, data->state.async.hostname,
                           data->state.async.port,
                           data->state.async.ip_version);
  if(*dns) {
    /* Tell a possibly async resolver we no longer need the results. */
    infof(data, "Hostname '%s' was found in DNS cache",
          data->state.async.hostname);
    Curl_async_shutdown(data);
    data->state.async.dns = *dns;
    data->state.async.done = TRUE;
    return CURLE_OK;
  }

#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh) {
    result = Curl_doh_is_resolved(data, dns);
  }
  else
#endif
  result = Curl_async_is_resolved(data, dns);
  if(*dns)
    show_resolve_info(data, *dns);
  return result;
}